

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::formatReconstructedExpression(Catch *this,ostream *os,string *lhs,StringRef op,string *rhs)

{
  size_type sVar1;
  size_type sVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string *rhs_local;
  string *lhs_local;
  ostream *os_local;
  StringRef op_local;
  
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)op.m_size;
  op_local.m_start = op.m_start;
  os_local = (ostream *)lhs;
  sVar1 = clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)os);
  sVar2 = clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          size(this_00);
  if (((sVar1 + sVar2 < 0x28) &&
      (sVar1 = clara::std::__cxx11::
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)os,
                          '\n',0), sVar1 == 0xffffffffffffffff)) &&
     (sVar1 = clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
              ::find(this_00,'\n',0), sVar1 == 0xffffffffffffffff)) {
    poVar3 = std::operator<<((ostream *)this,(string *)os);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = operator<<(poVar3,(StringRef *)&os_local);
    poVar3 = std::operator<<(poVar3," ");
    std::operator<<(poVar3,(string *)this_00);
    return;
  }
  poVar3 = std::operator<<((ostream *)this,(string *)os);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = operator<<(poVar3,(StringRef *)&os_local);
  poVar3 = std::operator<<(poVar3,"\n");
  std::operator<<(poVar3,(string *)this_00);
  return;
}

Assistant:

void formatReconstructedExpression(std::ostream &os, std::string const &lhs, StringRef op, std::string const &rhs) {
    if (lhs.size() + rhs.size() < 40 && lhs.find('\n') == std::string::npos && rhs.find('\n') == std::string::npos)
      os << lhs << " " << op << " " << rhs;
    else
      os << lhs << "\n"
         << op << "\n"
         << rhs;
  }